

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8 * __thiscall google::protobuf::io::EpsCopyOutputStream::Next(EpsCopyOutputStream *this)

{
  undefined8 uVar1;
  int iVar2;
  LogMessage *pLVar3;
  uint8 *puVar4;
  LogMessage local_b8;
  uint8 *local_80;
  void *data;
  uint8 *local_48;
  uint8 *local_40;
  uint local_38;
  LogFinisher local_31;
  int size;
  
  if (this->had_error_ == true) {
    internal::LogMessage::LogMessage
              (&local_b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/coded_stream.cc"
               ,0x314);
    pLVar3 = internal::LogMessage::operator<<(&local_b8,"CHECK failed: !had_error_: ");
    internal::LogFinisher::operator=((LogFinisher *)&stack0xffffffffffffff80,pLVar3);
    internal::LogMessage::~LogMessage(&local_b8);
  }
  if (this->stream_ == (ZeroCopyOutputStream *)0x0) {
    this->had_error_ = true;
  }
  else {
    puVar4 = this->end_;
    local_40 = this->buffer_;
    if (this->buffer_end_ != (uint8 *)0x0) {
      memcpy(this->buffer_end_,local_40,(long)puVar4 - (long)local_40);
      local_48 = this->buffer_ + 0x10;
      do {
        iVar2 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])
                          (this->stream_,&stack0xffffffffffffff80,&local_38);
        if ((char)iVar2 == '\0') {
          this->had_error_ = true;
          this->end_ = local_48;
          return local_40;
        }
      } while ((ulong)local_38 == 0);
      if (0x10 < (int)local_38) {
        uVar1 = *(undefined8 *)(this->end_ + 8);
        *(undefined8 *)local_80 = *(undefined8 *)this->end_;
        *(undefined8 *)(local_80 + 8) = uVar1;
        this->end_ = local_80 + ((ulong)local_38 - 0x10);
        this->buffer_end_ = (uint8 *)0x0;
        return local_80;
      }
      if ((int)local_38 < 1) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&stack0xffffffffffffff80,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/coded_stream.cc"
                   ,0x32a);
        pLVar3 = internal::LogMessage::operator<<
                           ((LogMessage *)&stack0xffffffffffffff80,"CHECK failed: size > 0: ");
        internal::LogFinisher::operator=(&local_31,pLVar3);
        internal::LogMessage::~LogMessage((LogMessage *)&stack0xffffffffffffff80);
      }
      uVar1 = *(undefined8 *)(this->end_ + 8);
      *(undefined8 *)local_40 = *(undefined8 *)this->end_;
      *(undefined8 *)(local_40 + 8) = uVar1;
      this->buffer_end_ = local_80;
      puVar4 = local_40 + (int)local_38;
      goto LAB_0023aff6;
    }
    uVar1 = *(undefined8 *)(puVar4 + 8);
    *(undefined8 *)local_40 = *(undefined8 *)puVar4;
    *(undefined8 *)(this->buffer_ + 8) = uVar1;
    this->buffer_end_ = puVar4;
  }
  local_40 = this->buffer_;
  puVar4 = this->buffer_ + 0x10;
LAB_0023aff6:
  this->end_ = puVar4;
  return local_40;
}

Assistant:

uint8* EpsCopyOutputStream::Next() {
  GOOGLE_DCHECK(!had_error_);  // NOLINT
  if (PROTOBUF_PREDICT_FALSE(stream_ == nullptr)) return Error();
  if (buffer_end_) {
    // We're in the patch buffer and need to fill up the previous buffer.
    std::memcpy(buffer_end_, buffer_, end_ - buffer_);
    uint8* ptr;
    int size;
    do {
      void* data;
      if (PROTOBUF_PREDICT_FALSE(!stream_->Next(&data, &size))) {
        // Stream has an error, we use the patch buffer to continue to be
        // able to write.
        return Error();
      }
      ptr = static_cast<uint8*>(data);
    } while (size == 0);
    if (PROTOBUF_PREDICT_TRUE(size > kSlopBytes)) {
      std::memcpy(ptr, end_, kSlopBytes);
      end_ = ptr + size - kSlopBytes;
      buffer_end_ = nullptr;
      return ptr;
    } else {
      GOOGLE_DCHECK(size > 0);  // NOLINT
      // Buffer to small
      std::memmove(buffer_, end_, kSlopBytes);
      buffer_end_ = ptr;
      end_ = buffer_ + size;
      return buffer_;
    }
  } else {
    std::memcpy(buffer_, end_, kSlopBytes);
    buffer_end_ = end_;
    end_ = buffer_ + kSlopBytes;
    return buffer_;
  }
}